

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<unsigned_char,_4UL>,_void>::
     load(iarchive *ar,array<unsigned_char,_4UL> *data,uint param_3)

{
  uint uVar1;
  size_type size;
  error *this;
  undefined4 in_register_00000014;
  
  uVar1 = (ar->reader).decoder.current.code - array8_int8;
  if ((uVar1 * 0x10000000 | uVar1 >> 4) < 4) {
    size = bintoken::reader::length(&ar->reader);
    if (size < 5) {
      bintoken::iarchive::load_array<unsigned_char>(ar,data->_M_elems,size);
      return;
    }
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,overflow);
  }
  else {
    this = (error *)__cxa_allocate_exception(0x20,data,CONCAT44(in_register_00000014,param_3));
    bintoken::error::error(this,incompatible_type);
  }
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(bintoken::iarchive& ar,
                     std::array<std::uint8_t, N>& data,
                     const unsigned int /* protocol_version */)
    {
        switch (ar.code())
        {
        case bintoken::token::code::array8_int8:
        case bintoken::token::code::array16_int8:
        case bintoken::token::code::array32_int8:
        case bintoken::token::code::array64_int8:
            {
                const auto length = ar.length();
                if (length > N)
                {
                    throw bintoken::error(bintoken::overflow);
                }
                ar.load_array(data.data(), length);
            }
            break;

        default:
            throw bintoken::error(bintoken::incompatible_type);
        }
    }